

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O1

void rtr_bgpsec_append_sec_path_seg(rtr_bgpsec *bgpsec,rtr_secure_path_seg *new_seg)

{
  long lVar1;
  rtr_secure_path_seg *prVar2;
  rtr_secure_path_seg *prVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prVar2 = bgpsec->path;
  if (bgpsec->path == (rtr_secure_path_seg *)0x0) {
    prVar3 = (rtr_secure_path_seg *)&bgpsec->path;
  }
  else {
    do {
      prVar3 = prVar2;
      prVar2 = prVar3->next;
    } while (prVar3->next != (rtr_secure_path_seg *)0x0);
  }
  prVar3->next = new_seg;
  bgpsec->path_len = bgpsec->path_len + '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void rtr_bgpsec_append_sec_path_seg(struct rtr_bgpsec *bgpsec, struct rtr_secure_path_seg *new_seg)
{
	struct rtr_secure_path_seg *last = bgpsec->path;

	if (bgpsec->path) {
		while (last->next)
			last = last->next;
		last->next = new_seg;
	} else {
		bgpsec->path = new_seg;
	}

	bgpsec->path_len++;
}